

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.h
# Opt level: O3

string * get_log_file(string *__return_storage_ptr__,string *file_base)

{
  pointer pcVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  __pid_t _Var5;
  ostream *poVar6;
  string local_90;
  string local_70;
  Logger local_50;
  undefined4 uStack_4c;
  undefined1 local_40 [16];
  
  if (file_base->_M_string_length != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    pcVar1 = (file_base->_M_dataplus)._M_p;
    get_host_name_abi_cxx11_();
    _Var4._M_p = local_70._M_dataplus._M_p;
    get_user_name_abi_cxx11_();
    _Var3._M_p = local_90._M_dataplus._M_p;
    print_current_time_abi_cxx11_();
    uVar2 = CONCAT44(uStack_4c,local_50.severity_);
    _Var5 = getpid();
    SStringPrintf(__return_storage_ptr__,"%s.%s.%s.%s.%u",pcVar1,_Var4._M_p,_Var3._M_p,uVar2,_Var5);
    if ((undefined1 *)CONCAT44(uStack_4c,local_50.severity_) != local_40) {
      operator_delete((undefined1 *)CONCAT44(uStack_4c,local_50.severity_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50.severity_ = ERR;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/system.h"
             ,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"get_log_file","");
  poVar6 = Logger::Start(ERR,&local_70,0x4a,&local_90);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"CHECK failed ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/system.h"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x4a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!file_base.empty()",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
  poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  Logger::~Logger(&local_50);
  abort();
}

Assistant:

std::string get_log_file(const std::string& file_base) {
  CHECK(!file_base.empty());
  std::string filename_prefix;
  SStringPrintf(&filename_prefix,
                "%s.%s.%s.%s.%u",
                file_base.c_str(),
                get_host_name().c_str(),
                get_user_name().c_str(),
                print_current_time().c_str(),
                getpid());
  return filename_prefix;
}